

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)10>_>
          (undefined8 param_1,undefined8 param_2,xml_node_struct *param_3,undefined8 param_4,
          byte param_5)

{
  bool bVar1;
  xml_node_struct *cur;
  axis_t axis;
  xpath_allocator *in_stack_000000d0;
  xml_node_struct *in_stack_000000d8;
  xpath_node_set_raw *in_stack_000000e0;
  xpath_ast_node *in_stack_000000e8;
  xml_node_struct *local_38;
  
  local_38 = param_3;
  while (local_38->prev_sibling_c->next_sibling == (xml_node_struct *)0x0) {
    local_38 = local_38->parent;
    if (local_38 == (xml_node_struct *)0x0) {
      return;
    }
  }
  local_38 = local_38->prev_sibling_c;
LAB_00146d41:
  while( true ) {
    if (local_38 == (xml_node_struct *)0x0) {
      return;
    }
    if (local_38->first_child == (xml_node_struct *)0x0) break;
    local_38 = local_38->first_child->prev_sibling_c;
  }
  bVar1 = step_push(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  do {
    if ((bVar1 & param_5 & 1) != 0) {
      return;
    }
    do {
      if (local_38->prev_sibling_c->next_sibling != (xml_node_struct *)0x0) {
        local_38 = local_38->prev_sibling_c;
        goto LAB_00146d41;
      }
      local_38 = local_38->parent;
      if (local_38 == (xml_node_struct *)0x0) {
        return;
      }
      bVar1 = node_is_ancestor(local_38,param_3);
    } while (bVar1);
    bVar1 = step_push(in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
  } while( true );
}

Assistant:

void step_fill(xpath_node_set_raw& ns, xml_node_struct* n, xpath_allocator* alloc, bool once, T)
		{
			const axis_t axis = T::axis;

			switch (axis)
			{
			case axis_attribute:
			{
				for (xml_attribute_struct* a = n->first_attribute; a; a = a->next_attribute)
					if (step_push(ns, a, n, alloc) & once)
						return;

				break;
			}

			case axis_child:
			{
				for (xml_node_struct* c = n->first_child; c; c = c->next_sibling)
					if (step_push(ns, c, alloc) & once)
						return;

				break;
			}

			case axis_descendant:
			case axis_descendant_or_self:
			{
				if (axis == axis_descendant_or_self)
					if (step_push(ns, n, alloc) & once)
						return;

				xml_node_struct* cur = n->first_child;

				while (cur)
				{
					if (step_push(ns, cur, alloc) & once)
						return;

					if (cur->first_child)
						cur = cur->first_child;
					else
					{
						while (!cur->next_sibling)
						{
							cur = cur->parent;

							if (cur == n) return;
						}

						cur = cur->next_sibling;
					}
				}

				break;
			}

			case axis_following_sibling:
			{
				for (xml_node_struct* c = n->next_sibling; c; c = c->next_sibling)
					if (step_push(ns, c, alloc) & once)
						return;

				break;
			}

			case axis_preceding_sibling:
			{
				for (xml_node_struct* c = n->prev_sibling_c; c->next_sibling; c = c->prev_sibling_c)
					if (step_push(ns, c, alloc) & once)
						return;

				break;
			}

			case axis_following:
			{
				xml_node_struct* cur = n;

				// exit from this node so that we don't include descendants
				while (!cur->next_sibling)
				{
					cur = cur->parent;

					if (!cur) return;
				}

				cur = cur->next_sibling;

				while (cur)
				{
					if (step_push(ns, cur, alloc) & once)
						return;

					if (cur->first_child)
						cur = cur->first_child;
					else
					{
						while (!cur->next_sibling)
						{
							cur = cur->parent;

							if (!cur) return;
						}

						cur = cur->next_sibling;
					}
				}

				break;
			}

			case axis_preceding:
			{
				xml_node_struct* cur = n;

				// exit from this node so that we don't include descendants
				while (!cur->prev_sibling_c->next_sibling)
				{
					cur = cur->parent;

					if (!cur) return;
				}

				cur = cur->prev_sibling_c;

				while (cur)
				{
					if (cur->first_child)
						cur = cur->first_child->prev_sibling_c;
					else
					{
						// leaf node, can't be ancestor
						if (step_push(ns, cur, alloc) & once)
							return;

						while (!cur->prev_sibling_c->next_sibling)
						{
							cur = cur->parent;

							if (!cur) return;

							if (!node_is_ancestor(cur, n))
								if (step_push(ns, cur, alloc) & once)
									return;
						}

						cur = cur->prev_sibling_c;
					}
				}

				break;
			}

			case axis_ancestor:
			case axis_ancestor_or_self:
			{
				if (axis == axis_ancestor_or_self)
					if (step_push(ns, n, alloc) & once)
						return;

				xml_node_struct* cur = n->parent;

				while (cur)
				{
					if (step_push(ns, cur, alloc) & once)
						return;

					cur = cur->parent;
				}

				break;
			}

			case axis_self:
			{
				step_push(ns, n, alloc);

				break;
			}

			case axis_parent:
			{
				if (n->parent)
					step_push(ns, n->parent, alloc);

				break;
			}

			default:
				assert(false && "Unimplemented axis"); // unreachable
			}
		}